

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cpp
# Opt level: O2

void duckdb::RegexpMatchesFunction<duckdb::RegexFullMatch>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  VectorType VVar1;
  VectorType VVar2;
  anon_union_16_2_67f50693_for_value *paVar3;
  unsigned_long *puVar4;
  sel_t *psVar5;
  _func_int **pp_Var6;
  SelectionVector *pSVar7;
  SelectionVector *pSVar8;
  bool bVar9;
  reference vector;
  reference vector_00;
  BoundFunctionExpression *pBVar10;
  anon_class_8_1_898d11ac fun;
  idx_t iVar11;
  Vector *pVVar12;
  idx_t i_1;
  ulong uVar13;
  data_ptr_t pdVar14;
  idx_t iVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  idx_t iVar19;
  void *in_R8;
  ValidityMask *in_R9;
  idx_t i_2;
  data_ptr_t pdVar20;
  ulong uVar21;
  ulong uVar22;
  data_ptr_t pdVar23;
  idx_t i;
  ulong uVar24;
  ValidityMask *other;
  idx_t iVar25;
  ulong uVar26;
  string_t input;
  string_t input_00;
  string_t input_01;
  string_t input_02;
  string_t input_03;
  string_t left;
  string_t left_00;
  string_t left_01;
  string_t left_02;
  string_t left_03;
  string_t left_04;
  string_t left_05;
  string_t left_06;
  string_t right;
  string_t right_00;
  string_t right_01;
  string_t right_02;
  string_t right_03;
  string_t right_04;
  string_t right_05;
  string_t right_06;
  ValidityMask *pVVar27;
  Vector *pVVar28;
  TemplatedValidityMask<unsigned_long> *this;
  data_ptr_t local_e8;
  UnifiedVectorFormat ldata;
  UnifiedVectorFormat local_78;
  
  vector = vector<duckdb::Vector,_true>::get<true>(&args->data,0);
  vector_00 = vector<duckdb::Vector,_true>::get<true>(&args->data,1);
  pBVar10 = BaseExpression::Cast<duckdb::BoundFunctionExpression>
                      (&state->expr->super_BaseExpression);
  fun.info = (RegexpMatchesBindData *)
             unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
             operator->(&pBVar10->bind_info);
  if (((fun.info)->super_RegexpBaseBindData).constant_pattern == true) {
    ldata.sel = (SelectionVector *)state[1]._vptr_ExpressionState;
    pVVar12 = result;
    local_78.sel = (SelectionVector *)
                   optional_ptr<duckdb::FunctionLocalState,_true>::operator->
                             ((optional_ptr<duckdb::FunctionLocalState,_true> *)&ldata);
    iVar11 = args->count;
    if (vector->vector_type == FLAT_VECTOR) {
      iVar25 = iVar11;
      Vector::SetVectorType(result,FLAT_VECTOR);
      pdVar14 = result->data;
      pdVar23 = vector->data;
      FlatVector::VerifyFlatVector(vector);
      FlatVector::VerifyFlatVector(result);
      if ((vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        pdVar23 = pdVar23 + 8;
        for (iVar15 = 0; iVar11 != iVar15; iVar15 = iVar15 + 1) {
          input_02.value.pointer.ptr = (char *)*(undefined8 *)pdVar23;
          input_02.value._0_8_ = *(undefined8 *)(pdVar23 + -8);
          bVar9 = UnaryLambdaWrapper::
                  Operation<duckdb::RegexpMatchesFunction<duckdb::RegexFullMatch>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t)_1_,duckdb::string_t,bool>
                            (input_02,(ValidityMask *)&local_78,iVar25,in_R8);
          pdVar14[iVar15] = bVar9;
          pdVar23 = pdVar23 + 0x10;
        }
        return;
      }
      other = &vector->validity;
      TemplatedValidityMask<unsigned_long>::Initialize
                (&(result->validity).super_TemplatedValidityMask<unsigned_long>,
                 &other->super_TemplatedValidityMask<unsigned_long>);
      uVar21 = 0;
      uVar18 = 0;
      pVVar27 = other;
      do {
        if (uVar21 == iVar11 + 0x3f >> 6) {
          return;
        }
        puVar4 = (other->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (puVar4 == (unsigned_long *)0x0) {
          uVar13 = uVar18 + 0x40;
          if (iVar11 <= uVar18 + 0x40) {
            uVar13 = iVar11;
          }
LAB_00825cfe:
          pdVar20 = pdVar23 + uVar18 * 0x10 + 8;
          other = pVVar27;
          for (; uVar22 = uVar18, pVVar27 = other, uVar18 < uVar13; uVar18 = uVar18 + 1) {
            input.value.pointer.ptr = (char *)*(undefined8 *)pdVar20;
            input.value._0_8_ = *(undefined8 *)(pdVar20 + -8);
            bVar9 = UnaryLambdaWrapper::
                    Operation<duckdb::RegexpMatchesFunction<duckdb::RegexFullMatch>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t)_1_,duckdb::string_t,bool>
                              (input,(ValidityMask *)&local_78,iVar25,in_R8);
            pdVar14[uVar18] = bVar9;
            pdVar20 = pdVar20 + 0x10;
          }
        }
        else {
          uVar16 = puVar4[uVar21];
          uVar13 = uVar18 + 0x40;
          if (iVar11 <= uVar18 + 0x40) {
            uVar13 = iVar11;
          }
          if (uVar16 == 0xffffffffffffffff) goto LAB_00825cfe;
          uVar22 = uVar13;
          if (uVar16 != 0) {
            pdVar20 = pdVar23 + uVar18 * 0x10 + 8;
            uVar24 = 0;
            other = pVVar27;
            for (; uVar22 = uVar18, pVVar27 = other, uVar18 < uVar13; uVar18 = uVar18 + 1) {
              if ((uVar16 >> (uVar24 & 0x3f) & 1) != 0) {
                input_00.value.pointer.ptr = (char *)*(undefined8 *)pdVar20;
                input_00.value._0_8_ = *(undefined8 *)(pdVar20 + -8);
                bVar9 = UnaryLambdaWrapper::
                        Operation<duckdb::RegexpMatchesFunction<duckdb::RegexFullMatch>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t)_1_,duckdb::string_t,bool>
                                  (input_00,(ValidityMask *)&local_78,iVar25,in_R8);
                pdVar14[uVar18] = bVar9;
              }
              pdVar20 = pdVar20 + 0x10;
              uVar24 = uVar24 + 1;
            }
          }
        }
        uVar21 = uVar21 + 1;
        uVar18 = uVar22;
      } while( true );
    }
    if (vector->vector_type != CONSTANT_VECTOR) {
      UnifiedVectorFormat::UnifiedVectorFormat(&ldata);
      Vector::ToUnifiedFormat(vector,iVar11,&ldata);
      Vector::SetVectorType(result,FLAT_VECTOR);
      pSVar7 = ldata.sel;
      pdVar14 = result->data;
      FlatVector::VerifyFlatVector(result);
      if (ldata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        for (iVar25 = 0; iVar11 != iVar25; iVar25 = iVar25 + 1) {
          psVar5 = pSVar7->sel_vector;
          iVar15 = iVar25;
          if (psVar5 != (sel_t *)0x0) {
            iVar15 = (idx_t)psVar5[iVar25];
          }
          input_03.value.pointer.ptr = (char *)*(undefined8 *)(ldata.data + iVar15 * 0x10 + 8);
          input_03.value._0_8_ = *(undefined8 *)(ldata.data + iVar15 * 0x10);
          bVar9 = UnaryLambdaWrapper::
                  Operation<duckdb::RegexpMatchesFunction<duckdb::RegexFullMatch>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t)_1_,duckdb::string_t,bool>
                            (input_03,(ValidityMask *)&local_78,(idx_t)psVar5,in_R8);
          pdVar14[iVar25] = bVar9;
        }
      }
      else {
        for (iVar25 = 0; iVar11 != iVar25; iVar25 = iVar25 + 1) {
          psVar5 = pSVar7->sel_vector;
          iVar15 = iVar25;
          if (psVar5 != (sel_t *)0x0) {
            iVar15 = (idx_t)psVar5[iVar25];
          }
          if ((ldata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar15 >> 6]
               >> (iVar15 & 0x3f) & 1) == 0) {
            TemplatedValidityMask<unsigned_long>::SetInvalid
                      (&(result->validity).super_TemplatedValidityMask<unsigned_long>,iVar25);
          }
          else {
            input_01.value.pointer.ptr = (char *)*(undefined8 *)(ldata.data + iVar15 * 0x10 + 8);
            input_01.value._0_8_ = *(undefined8 *)(ldata.data + iVar15 * 0x10);
            bVar9 = UnaryLambdaWrapper::
                    Operation<duckdb::RegexpMatchesFunction<duckdb::RegexFullMatch>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t)_1_,duckdb::string_t,bool>
                              (input_01,(ValidityMask *)&local_78,
                               ldata.validity.super_TemplatedValidityMask<unsigned_long>.
                               validity_mask[iVar15 >> 6],in_R8);
            pdVar14[iVar25] = bVar9;
          }
        }
      }
LAB_00826470:
      UnifiedVectorFormat::~UnifiedVectorFormat(&ldata);
      return;
    }
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    pdVar14 = result->data;
    paVar3 = (anon_union_16_2_67f50693_for_value *)vector->data;
    puVar4 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar4 != (unsigned_long *)0x0) && ((*puVar4 & 1) == 0)) {
      ConstantVector::SetNull(pVVar12,true);
      return;
    }
    ConstantVector::SetNull(pVVar12,false);
    bVar9 = UnaryLambdaWrapper::
            Operation<duckdb::RegexpMatchesFunction<duckdb::RegexFullMatch>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t)_1_,duckdb::string_t,bool>
                      ((string_t)paVar3->pointer,(ValidityMask *)&local_78,iVar11,in_R8);
LAB_00825ee4:
    *pdVar14 = bVar9;
    return;
  }
  VVar1 = vector->vector_type;
  VVar2 = vector_00->vector_type;
  pVVar12 = result;
  if ((VVar1 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar2 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    puVar4 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    pdVar14 = result->data;
    if (((puVar4 == (unsigned_long *)0x0) || ((*puVar4 & 1) != 0)) &&
       ((puVar4 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
        puVar4 == (unsigned_long *)0x0 || ((*puVar4 & 1) != 0)))) {
      bVar9 = BinaryLambdaWrapper::
              Operation<duckdb::RegexpMatchesFunction<duckdb::RegexFullMatch>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::string_t)_1_,bool,duckdb::string_t,duckdb::string_t,bool>
                        (fun,(string_t)((anon_union_16_2_67f50693_for_value *)vector->data)->pointer
                         ,(string_t)((anon_union_16_2_67f50693_for_value *)vector_00->data)->pointer
                         ,in_R9,(idx_t)pVVar12);
      goto LAB_00825ee4;
    }
  }
  else {
    iVar11 = args->count;
    if ((VVar2 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar1 == FLAT_VECTOR) {
      local_e8 = vector->data;
      paVar3 = (anon_union_16_2_67f50693_for_value *)vector_00->data;
      puVar4 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar4 == (unsigned_long *)0x0) || ((*puVar4 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar14 = result->data;
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector);
        FlatVector::SetValidity(result,&vector->validity);
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          local_e8 = local_e8 + 8;
          for (iVar25 = 0; iVar11 != iVar25; iVar25 = iVar25 + 1) {
            left_02.value.pointer.ptr = (char *)*(undefined8 *)local_e8;
            left_02.value._0_8_ = *(undefined8 *)(local_e8 + -8);
            bVar9 = BinaryLambdaWrapper::
                    Operation<duckdb::RegexpMatchesFunction<duckdb::RegexFullMatch>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::string_t)_1_,bool,duckdb::string_t,duckdb::string_t,bool>
                              (fun,left_02,(string_t)paVar3->pointer,in_R9,(idx_t)pVVar12);
            pdVar14[iVar25] = bVar9;
            local_e8 = local_e8 + 0x10;
          }
          return;
        }
        uVar18 = 0;
        uVar21 = 0;
        pVVar28 = pVVar12;
        do {
          if (uVar18 == iVar11 + 0x3f >> 6) {
            return;
          }
          puVar4 = (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar4 == (unsigned_long *)0x0) {
            uVar13 = uVar21 + 0x40;
            if (iVar11 <= uVar21 + 0x40) {
              uVar13 = iVar11;
            }
LAB_00825be4:
            pdVar23 = local_e8 + uVar21 * 0x10 + 8;
            pVVar12 = pVVar28;
            for (; uVar22 = uVar21, pVVar28 = pVVar12, uVar21 < uVar13; uVar21 = uVar21 + 1) {
              left_00.value.pointer.ptr = (char *)*(undefined8 *)pdVar23;
              left_00.value._0_8_ = *(undefined8 *)(pdVar23 + -8);
              bVar9 = BinaryLambdaWrapper::
                      Operation<duckdb::RegexpMatchesFunction<duckdb::RegexFullMatch>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::string_t)_1_,bool,duckdb::string_t,duckdb::string_t,bool>
                                (fun,left_00,(string_t)paVar3->pointer,in_R9,(idx_t)pVVar12);
              pdVar14[uVar21] = bVar9;
              pdVar23 = pdVar23 + 0x10;
            }
          }
          else {
            uVar16 = puVar4[uVar18];
            uVar13 = uVar21 + 0x40;
            if (iVar11 <= uVar21 + 0x40) {
              uVar13 = iVar11;
            }
            if (uVar16 == 0xffffffffffffffff) goto LAB_00825be4;
            uVar22 = uVar13;
            if (uVar16 != 0) {
              pdVar23 = local_e8 + uVar21 * 0x10 + 8;
              uVar24 = 0;
              pVVar12 = pVVar28;
              for (; uVar22 = uVar21, pVVar28 = pVVar12, uVar21 < uVar13; uVar21 = uVar21 + 1) {
                if ((uVar16 >> (uVar24 & 0x3f) & 1) != 0) {
                  left.value.pointer.ptr = (char *)*(undefined8 *)pdVar23;
                  left.value._0_8_ = *(undefined8 *)(pdVar23 + -8);
                  bVar9 = BinaryLambdaWrapper::
                          Operation<duckdb::RegexpMatchesFunction<duckdb::RegexFullMatch>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::string_t)_1_,bool,duckdb::string_t,duckdb::string_t,bool>
                                    (fun,left,(string_t)paVar3->pointer,in_R9,(idx_t)pVVar12);
                  pdVar14[uVar21] = bVar9;
                }
                pdVar23 = pdVar23 + 0x10;
                uVar24 = uVar24 + 1;
              }
            }
          }
          uVar21 = uVar22;
          uVar18 = uVar18 + 1;
        } while( true );
      }
    }
    else {
      if ((VVar1 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar2 != FLAT_VECTOR) {
        if (VVar2 == FLAT_VECTOR && VVar1 == FLAT_VECTOR) {
          pdVar14 = vector->data;
          pdVar23 = vector_00->data;
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar20 = result->data;
          FlatVector::VerifyFlatVector(result);
          FlatVector::VerifyFlatVector(vector);
          FlatVector::SetValidity(result,&vector->validity);
          FlatVector::VerifyFlatVector(vector_00);
          ValidityMask::Combine(&result->validity,&vector_00->validity,iVar11);
          if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            lVar17 = 8;
            for (iVar25 = 0; iVar11 != iVar25; iVar25 = iVar25 + 1) {
              left_06.value.pointer.ptr = (char *)*(undefined8 *)(pdVar14 + lVar17);
              left_06.value._0_8_ = *(undefined8 *)(pdVar14 + lVar17 + -8);
              right_06.value.pointer.ptr = (char *)*(undefined8 *)(pdVar23 + lVar17);
              right_06.value._0_8_ = *(undefined8 *)(pdVar23 + lVar17 + -8);
              bVar9 = BinaryLambdaWrapper::
                      Operation<duckdb::RegexpMatchesFunction<duckdb::RegexFullMatch>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::string_t)_1_,bool,duckdb::string_t,duckdb::string_t,bool>
                                (fun,left_06,right_06,in_R9,(idx_t)pVVar12);
              pdVar20[iVar25] = bVar9;
              lVar17 = lVar17 + 0x10;
            }
            return;
          }
          uVar21 = 0;
          uVar18 = 0;
          do {
            if (uVar21 == iVar11 + 0x3f >> 6) {
              return;
            }
            puVar4 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar4 == (unsigned_long *)0x0) {
              uVar13 = uVar18 + 0x40;
              if (iVar11 <= uVar18 + 0x40) {
                uVar13 = iVar11;
              }
LAB_0082635c:
              uVar16 = uVar18 << 4 | 8;
              for (uVar22 = uVar18; uVar22 < uVar13; uVar22 = uVar22 + 1) {
                left_04.value.pointer.ptr = (char *)*(undefined8 *)(pdVar14 + uVar16);
                left_04.value._0_8_ = *(undefined8 *)(pdVar14 + (uVar16 - 8));
                right_03.value.pointer.ptr = (char *)*(undefined8 *)(pdVar23 + uVar16);
                right_03.value._0_8_ = *(undefined8 *)(pdVar23 + (uVar16 - 8));
                bVar9 = BinaryLambdaWrapper::
                        Operation<duckdb::RegexpMatchesFunction<duckdb::RegexFullMatch>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::string_t)_1_,bool,duckdb::string_t,duckdb::string_t,bool>
                                  (fun,left_04,right_03,in_R9,uVar21);
                pdVar20[uVar22] = bVar9;
                uVar16 = uVar16 + 0x10;
              }
            }
            else {
              uVar16 = puVar4[uVar21];
              uVar13 = uVar18 + 0x40;
              if (iVar11 <= uVar18 + 0x40) {
                uVar13 = iVar11;
              }
              if (uVar16 == 0xffffffffffffffff) goto LAB_0082635c;
              uVar22 = uVar13;
              if (uVar16 != 0) {
                uVar24 = uVar18 << 4 | 8;
                uVar26 = 0;
                for (uVar22 = uVar18; uVar22 < uVar13; uVar22 = uVar22 + 1) {
                  if ((uVar16 >> (uVar26 & 0x3f) & 1) != 0) {
                    left_03.value.pointer.ptr = (char *)*(undefined8 *)(pdVar14 + uVar24);
                    left_03.value._0_8_ = *(undefined8 *)(pdVar14 + (uVar24 - 8));
                    right_02.value.pointer.ptr = (char *)*(undefined8 *)(pdVar23 + uVar24);
                    right_02.value._0_8_ = *(undefined8 *)(pdVar23 + (uVar24 - 8));
                    bVar9 = BinaryLambdaWrapper::
                            Operation<duckdb::RegexpMatchesFunction<duckdb::RegexFullMatch>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::string_t)_1_,bool,duckdb::string_t,duckdb::string_t,bool>
                                      (fun,left_03,right_02,in_R9,uVar21);
                    pdVar20[uVar22] = bVar9;
                  }
                  uVar24 = uVar24 + 0x10;
                  uVar26 = uVar26 + 1;
                }
              }
            }
            uVar21 = uVar21 + 1;
            uVar18 = uVar22;
          } while( true );
        }
        UnifiedVectorFormat::UnifiedVectorFormat(&ldata);
        UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
        Vector::ToUnifiedFormat(vector,iVar11,&ldata);
        Vector::ToUnifiedFormat(vector_00,iVar11,&local_78);
        Vector::SetVectorType(result,FLAT_VECTOR);
        pSVar8 = local_78.sel;
        pSVar7 = ldata.sel;
        pdVar14 = result->data;
        FlatVector::VerifyFlatVector(result);
        if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0 &&
            ldata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          for (iVar25 = 0; iVar11 != iVar25; iVar25 = iVar25 + 1) {
            psVar5 = pSVar7->sel_vector;
            iVar15 = iVar25;
            if (psVar5 != (sel_t *)0x0) {
              iVar15 = (idx_t)psVar5[iVar25];
            }
            pp_Var6 = (_func_int **)pSVar8->sel_vector;
            iVar19 = iVar25;
            if (pp_Var6 != (_func_int **)0x0) {
              iVar19 = (idx_t)*(uint *)((long)pp_Var6 + iVar25 * 4);
            }
            left_01.value.pointer.ptr = (char *)*(undefined8 *)(ldata.data + iVar15 * 0x10 + 8);
            left_01.value._0_8_ = *(undefined8 *)(ldata.data + iVar15 * 0x10);
            right.value.pointer.ptr = (char *)*(undefined8 *)(local_78.data + (iVar19 * 2 + 1) * 8);
            right.value._0_8_ = *(undefined8 *)(local_78.data + iVar19 * 0x10);
            bVar9 = BinaryLambdaWrapper::
                    Operation<duckdb::RegexpMatchesFunction<duckdb::RegexFullMatch>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::string_t)_1_,bool,duckdb::string_t,duckdb::string_t,bool>
                              (fun,left_01,right,in_R9,(idx_t)result);
            pdVar14[iVar25] = bVar9;
          }
        }
        else {
          this = &(result->validity).super_TemplatedValidityMask<unsigned_long>;
          for (iVar25 = 0; iVar11 != iVar25; iVar25 = iVar25 + 1) {
            psVar5 = pSVar7->sel_vector;
            iVar15 = iVar25;
            if (psVar5 != (sel_t *)0x0) {
              iVar15 = (idx_t)psVar5[iVar25];
            }
            pp_Var6 = (_func_int **)pSVar8->sel_vector;
            iVar19 = iVar25;
            if (pp_Var6 != (_func_int **)0x0) {
              iVar19 = (idx_t)*(uint *)((long)pp_Var6 + iVar25 * 4);
            }
            if (((ldata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                  (unsigned_long *)0x0) ||
                ((ldata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                  [iVar15 >> 6] >> (iVar15 & 0x3f) & 1) != 0)) &&
               ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                 (unsigned_long *)0x0 ||
                ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                  [iVar19 >> 6] >> (iVar19 & 0x3f) & 1) != 0)))) {
              left_05.value.pointer.ptr = (char *)*(undefined8 *)(ldata.data + iVar15 * 0x10 + 8);
              left_05.value._0_8_ = *(undefined8 *)(ldata.data + iVar15 * 0x10);
              right_04.value.pointer.ptr =
                   (char *)*(undefined8 *)(local_78.data + (iVar19 * 2 + 1) * 8);
              right_04.value._0_8_ = *(undefined8 *)(local_78.data + iVar19 * 0x10);
              bVar9 = BinaryLambdaWrapper::
                      Operation<duckdb::RegexpMatchesFunction<duckdb::RegexFullMatch>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::string_t)_1_,bool,duckdb::string_t,duckdb::string_t,bool>
                                (fun,left_05,right_04,in_R9,(idx_t)this);
              pdVar14[iVar25] = bVar9;
            }
            else {
              TemplatedValidityMask<unsigned_long>::SetInvalid(this,iVar25);
            }
          }
        }
        UnifiedVectorFormat::~UnifiedVectorFormat(&local_78);
        goto LAB_00826470;
      }
      paVar3 = (anon_union_16_2_67f50693_for_value *)vector->data;
      puVar4 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      local_e8 = vector_00->data;
      if ((puVar4 == (unsigned_long *)0x0) || ((*puVar4 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar14 = result->data;
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector_00);
        FlatVector::SetValidity(result,&vector_00->validity);
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          local_e8 = local_e8 + 8;
          for (iVar25 = 0; iVar11 != iVar25; iVar25 = iVar25 + 1) {
            right_05.value.pointer.ptr = (char *)*(undefined8 *)local_e8;
            right_05.value._0_8_ = *(undefined8 *)(local_e8 + -8);
            bVar9 = BinaryLambdaWrapper::
                    Operation<duckdb::RegexpMatchesFunction<duckdb::RegexFullMatch>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::string_t)_1_,bool,duckdb::string_t,duckdb::string_t,bool>
                              (fun,(string_t)paVar3->pointer,right_05,in_R9,(idx_t)pVVar12);
            pdVar14[iVar25] = bVar9;
            local_e8 = local_e8 + 0x10;
          }
          return;
        }
        uVar18 = 0;
        uVar21 = 0;
        pVVar28 = pVVar12;
        do {
          if (uVar18 == iVar11 + 0x3f >> 6) {
            return;
          }
          puVar4 = (pVVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar4 == (unsigned_long *)0x0) {
            uVar13 = uVar21 + 0x40;
            if (iVar11 <= uVar21 + 0x40) {
              uVar13 = iVar11;
            }
LAB_00826165:
            pdVar23 = local_e8 + uVar21 * 0x10 + 8;
            pVVar12 = pVVar28;
            for (; uVar22 = uVar21, pVVar28 = pVVar12, uVar21 < uVar13; uVar21 = uVar21 + 1) {
              right_01.value.pointer.ptr = (char *)*(undefined8 *)pdVar23;
              right_01.value._0_8_ = *(undefined8 *)(pdVar23 + -8);
              bVar9 = BinaryLambdaWrapper::
                      Operation<duckdb::RegexpMatchesFunction<duckdb::RegexFullMatch>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::string_t)_1_,bool,duckdb::string_t,duckdb::string_t,bool>
                                (fun,(string_t)paVar3->pointer,right_01,in_R9,(idx_t)pVVar12);
              pdVar14[uVar21] = bVar9;
              pdVar23 = pdVar23 + 0x10;
            }
          }
          else {
            uVar16 = puVar4[uVar18];
            uVar13 = uVar21 + 0x40;
            if (iVar11 <= uVar21 + 0x40) {
              uVar13 = iVar11;
            }
            if (uVar16 == 0xffffffffffffffff) goto LAB_00826165;
            uVar22 = uVar13;
            if (uVar16 != 0) {
              pdVar23 = local_e8 + uVar21 * 0x10 + 8;
              uVar24 = 0;
              pVVar12 = pVVar28;
              for (; uVar22 = uVar21, pVVar28 = pVVar12, uVar21 < uVar13; uVar21 = uVar21 + 1) {
                if ((uVar16 >> (uVar24 & 0x3f) & 1) != 0) {
                  right_00.value.pointer.ptr = (char *)*(undefined8 *)pdVar23;
                  right_00.value._0_8_ = *(undefined8 *)(pdVar23 + -8);
                  bVar9 = BinaryLambdaWrapper::
                          Operation<duckdb::RegexpMatchesFunction<duckdb::RegexFullMatch>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(duckdb::string_t,duckdb::string_t)_1_,bool,duckdb::string_t,duckdb::string_t,bool>
                                    (fun,(string_t)paVar3->pointer,right_00,in_R9,(idx_t)pVVar12);
                  pdVar14[uVar21] = bVar9;
                }
                pdVar23 = pdVar23 + 0x10;
                uVar24 = uVar24 + 1;
              }
            }
          }
          uVar21 = uVar22;
          uVar18 = uVar18 + 1;
        } while( true );
      }
    }
    Vector::SetVectorType(result,CONSTANT_VECTOR);
  }
  ConstantVector::SetNull(pVVar12,true);
  return;
}

Assistant:

static void RegexpMatchesFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &strings = args.data[0];
	auto &patterns = args.data[1];

	auto &func_expr = state.expr.Cast<BoundFunctionExpression>();
	auto &info = func_expr.bind_info->Cast<RegexpMatchesBindData>();

	if (info.constant_pattern) {
		auto &lstate = ExecuteFunctionState::GetFunctionState(state)->Cast<RegexLocalState>();
		UnaryExecutor::Execute<string_t, bool>(strings, result, args.size(), [&](string_t input) {
			return OP::Operation(CreateStringPiece(input), lstate.constant_pattern);
		});
	} else {
		BinaryExecutor::Execute<string_t, string_t, bool>(strings, patterns, result, args.size(),
		                                                  [&](string_t input, string_t pattern) {
			                                                  RE2 re(CreateStringPiece(pattern), info.options);
			                                                  if (!re.ok()) {
				                                                  throw InvalidInputException(re.error());
			                                                  }
			                                                  return OP::Operation(CreateStringPiece(input), re);
		                                                  });
	}
}